

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

NodePtr __thiscall dh::analysis::if_stmt(analysis *this)

{
  TYPE TVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  analysis *in_RSI;
  NodePtr NVar2;
  NodePtr tmp_ptr;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  string local_78;
  string local_58;
  string local_38;
  
  local_98._0_4_ =
       token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr);
  std::make_shared<dh::TreeNode,char_const(&)[3],int>((char (*) [3])this,(int *)"if");
  std::__cxx11::string::string((string *)&local_38,"if",(allocator *)local_98);
  match(in_RSI,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_98._0_4_ = 4;
  TreeNode::setNodeKind(*(TreeNode **)this,(int *)local_98);
  local_98._0_4_ = 1;
  TreeNode::setKind(*(TreeNode **)this,(int *)local_98);
  std::__cxx11::string::string((string *)&local_58,"(",(allocator *)local_98);
  match(in_RSI,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  assignment_expr((analysis *)local_98);
  std::__cxx11::string::string((string *)(local_88 + 0x10),")",(allocator *)local_88);
  match(in_RSI,(string *)(local_88 + 0x10));
  std::__cxx11::string::~string((string *)(local_88 + 0x10));
  TreeNode::appendChild(*(TreeNode **)this,(NodePtr *)local_98);
  stmt((analysis *)local_88);
  std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_98,
             (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  TreeNode::appendChild(*(TreeNode **)this,(NodePtr *)local_98);
  TVar1 = token::getType((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
  if (TVar1 == ELSE) {
    stmt((analysis *)local_88);
    std::__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_98,
               (__shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2> *)local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    TreeNode::appendChild(*(TreeNode **)this,(NodePtr *)local_98);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar2.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::if_stmt()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in if_stmt\n";
#endif
	NodePtr ret = ::std::make_shared<TreeNode>("if",tmp->getLineno());
	match("if");
	ret->setNodeKind(NodeKind::StmtK);
	ret->setKind(StmtKind::IfK);

	match("(");
	NodePtr tmp_ptr = expr();
	match(")");
	ret->appendChild(tmp_ptr);

	tmp_ptr = stmt();
	ret->appendChild(tmp_ptr);

	if ( tmp->getType() == TYPE::ELSE)
	{
		tmp_ptr = stmt();
		ret->appendChild(tmp_ptr);
	}

	return ret;
}